

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O2

void __thiscall
CKey::Set<unsigned_char_const*>(CKey *this,uchar *pbegin,uchar *pend,bool fCompressedIn)

{
  long lVar1;
  array<unsigned_char,_32UL> *paVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)pend - (long)pbegin == 0x20) {
    bVar6 = Check(pbegin);
    if (bVar6) {
      MakeKeyData(this);
      paVar2 = (this->keydata)._M_t.
               super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
               .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        uVar3 = *(undefined8 *)pbegin;
        uVar4 = *(undefined8 *)(pbegin + 8);
        uVar5 = *(undefined8 *)(pbegin + 0x18);
        *(undefined8 *)(paVar2->_M_elems + 0x10) = *(undefined8 *)(pbegin + 0x10);
        *(undefined8 *)(paVar2->_M_elems + 0x18) = uVar5;
        *(undefined8 *)paVar2->_M_elems = uVar3;
        *(undefined8 *)(paVar2->_M_elems + 8) = uVar4;
        this->fCompressed = fCompressedIn;
        return;
      }
      goto LAB_004e15ff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ClearKeyData(this);
    return;
  }
LAB_004e15ff:
  __stack_chk_fail();
}

Assistant:

void Set(const T pbegin, const T pend, bool fCompressedIn)
    {
        if (size_t(pend - pbegin) != std::tuple_size_v<KeyType>) {
            ClearKeyData();
        } else if (Check(UCharCast(&pbegin[0]))) {
            MakeKeyData();
            memcpy(keydata->data(), (unsigned char*)&pbegin[0], keydata->size());
            fCompressed = fCompressedIn;
        } else {
            ClearKeyData();
        }
    }